

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O2

char * __thiscall
rapidxml::memory_pool<char>::allocate_string(memory_pool<char> *this,char *source,size_t size)

{
  size_t sVar1;
  char *pcVar2;
  size_t i;
  
  if (source != (char *)0x0 || size != 0) {
    if (size == 0) {
      sVar1 = internal::measure<char>(source);
      size = sVar1 + 1;
    }
    pcVar2 = (char *)allocate_aligned(this,size);
    if (source != (char *)0x0) {
      for (sVar1 = 0; size != sVar1; sVar1 = sVar1 + 1) {
        pcVar2[sVar1] = source[sVar1];
      }
    }
    return pcVar2;
  }
  __assert_fail("source || size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Joshsora[P]kipy/dependencies/libki/third_party/rapidxml.hpp"
                ,0x1de,
                "Ch *rapidxml::memory_pool<>::allocate_string(const Ch *, std::size_t) [Ch = char]")
  ;
}

Assistant:

Ch *allocate_string(const Ch *source = 0, std::size_t size = 0)
        {
            assert(source || size);     // Either source or size (or both) must be specified
            if (size == 0)
                size = internal::measure(source) + 1;
            Ch *result = static_cast<Ch *>(allocate_aligned(size * sizeof(Ch)));
            if (source)
                for (std::size_t i = 0; i < size; ++i)
                    result[i] = source[i];
            return result;
        }